

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void DC8uvNoLeft_C(uint8_t *dst)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar8 = 4;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  lVar7 = 0;
  do {
    uVar1 = *(undefined4 *)(dst + lVar7 + -0x20);
    uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar5;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar5;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar8 = iVar8 + (int)uVar5;
    iVar9 = iVar9 + auVar4._4_4_;
    iVar10 = iVar10 + auVar3._8_4_;
    iVar11 = iVar11 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar7 = lVar7 + 4;
  } while (lVar7 != 8);
  lVar7 = 0;
  do {
    *(ulong *)(dst + lVar7) =
         (ulong)((uint)(iVar11 + iVar9 + iVar10 + iVar8) >> 3 & 0xff) * 0x101010101010101;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x100);
  return;
}

Assistant:

static void DC8uvNoLeft_C(uint8_t* dst) {   // DC with no left samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[i - BPS];
  }
  Put8x8uv(dc0 >> 3, dst);
}